

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_77::BinaryReaderIR::OnElseExpr(BinaryReaderIR *this)

{
  bool bVar1;
  Location local_58;
  IfExpr *local_38;
  IfExpr *if_expr;
  Expr *local_28;
  Expr *expr;
  LabelNode *label;
  BinaryReaderIR *this_local;
  
  label = (LabelNode *)this;
  if_expr._4_4_ = TopLabelExpr(this,(LabelNode **)&expr,&local_28);
  bVar1 = Failed(if_expr._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (*(int *)&expr->_vptr_Expr == 3) {
    local_38 = cast<wabt::IfExpr,wabt::Expr>(local_28);
    GetLocation(&local_58,this);
    (local_38->true_).end_loc.filename.data_ = local_58.filename.data_;
    (local_38->true_).end_loc.filename.size_ = local_58.filename.size_;
    (local_38->true_).end_loc.field_1.field_1.offset = (size_t)local_58.field_1.field_1.offset;
    *(undefined8 *)((long)&(local_38->true_).end_loc.field_1 + 8) = local_58.field_1._8_8_;
    (expr->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)&local_38->false_;
    *(undefined4 *)&expr->_vptr_Expr = 4;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,"else expression without matching if");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnElseExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));

  if (label->label_type == LabelType::If) {
    auto* if_expr = cast<IfExpr>(expr);
    if_expr->true_.end_loc = GetLocation();
    label->exprs = &if_expr->false_;
    label->label_type = LabelType::Else;
  } else {
    PrintError("else expression without matching if");
    return Result::Error;
  }

  return Result::Ok;
}